

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O1

FluxData *
KryoFlux::DecodeStream
          (FluxData *__return_storage_ptr__,Data *data,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *warnings)

{
  byte bVar1;
  ushort uVar2;
  pointer puVar3;
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  *this;
  uint *puVar4;
  size_t sVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  pointer puVar10;
  uint uVar11;
  int iVar12;
  pointer pbVar13;
  uint *puVar14;
  string info;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index_offsets;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_counts;
  string value;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  int local_134;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_130;
  int local_124;
  uint *local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  uint local_dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  *local_c0;
  string local_b8;
  string local_98;
  uint *local_78;
  pointer local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)warnings;
  local_c0 = (vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)__return_storage_ptr__;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_118,
             (long)(*(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_d8,
             (long)(*(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                   *(int *)&(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  puVar14 = (uint *)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_120 = (uint *)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if (puVar14 != local_120) {
    local_134 = 0xa293;
    iVar12 = 0;
    uVar9 = 0;
    local_124 = 0;
    do {
      iVar7 = (int)uVar9;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] =
           (uint)((ulong)((long)local_118.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_118.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
      puVar4 = (uint *)((long)puVar14 + 1);
      bVar1 = (byte)*puVar14;
      switch(bVar1) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4:
      case 5:
      case 6:
      case 7:
        goto switchD_001630ce_caseD_0;
      case 8:
        break;
      case 9:
        lVar6 = 1;
        goto LAB_0016319f;
      case 10:
        iVar7 = iVar7 + 1;
        lVar6 = 2;
LAB_0016319f:
        iVar7 = iVar7 + 1;
        puVar4 = (uint *)((long)puVar14 + lVar6 + 1);
        break;
      case 0xb:
        iVar12 = iVar12 + 0x10000;
        break;
      case 0xc:
        bVar1 = *(byte *)((long)puVar14 + 1);
        puVar4 = (uint *)((long)puVar14 + 2);
        iVar7 = iVar7 + 1;
        goto switchD_001630ce_caseD_0;
      case 0xd:
        uVar2 = *(ushort *)((long)puVar14 + 2);
        uVar8 = (uint)uVar2;
        if (*(byte *)((long)puVar14 + 1) < 0xe) {
          puVar4 = puVar14 + 1;
          switch(*(byte *)((long)puVar14 + 1)) {
          case 0:
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,"invalid OOB detected","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_130,&local_158);
            goto LAB_00163280;
          case 1:
            if (uVar2 != 8) {
              __assert_fail("size == 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                            ,0x10d,
                            "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                           );
            }
            break;
          case 2:
            if (uVar2 != 0xc) {
              __assert_fail("size == 12",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                            ,0x112,
                            "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                           );
            }
            if ((opt.hardsectors < 2) ||
               (local_124 = local_124 + 1, local_124 % opt.hardsectors == 0)) {
              local_158._M_dataplus._M_p._0_4_ = *puVar4;
              if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          (&local_f8,
                           (iterator)
                           local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_158);
              }
              else {
                *local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = *puVar4;
                local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            break;
          case 3:
            if (uVar2 != 8) {
              __assert_fail("size == 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                            ,0x120,
                            "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                           );
            }
            uVar11 = puVar14[2];
            if (uVar11 != 0) {
              if (uVar11 == 2) {
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"stream end (no index detected)","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_130,&local_158);
              }
              else if (uVar11 == 1) {
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"stream end (buffering problem)","");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_130,&local_158);
              }
              else {
                util::fmt_abi_cxx11_(&local_158,"stream end problem (%u)");
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_130,&local_158);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
            }
            break;
          case 4:
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            sVar5 = strlen((char *)puVar4);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_158,puVar4,(byte *)(sVar5 + (long)puVar4));
            local_dc = uVar8;
            local_78 = puVar4;
            util::split(&local_48,&local_158,',',false);
            local_70 = local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pbVar13 = local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                lVar6 = std::__cxx11::string::find((char)pbVar13,0x3d);
                if (lVar6 != -1) {
                  std::__cxx11::string::substr((ulong)&local_b8,(ulong)pbVar13);
                  util::trim(&local_98,&local_b8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::string::substr((ulong)&local_68,(ulong)pbVar13);
                  util::trim(&local_b8,&local_68);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68._M_dataplus._M_p != &local_68.field_2) {
                    operator_delete(local_68._M_dataplus._M_p,
                                    local_68.field_2._M_allocated_capacity + 1);
                  }
                  if (((local_98._M_string_length != 0) && (local_b8._M_string_length != 0)) &&
                     (iVar7 = std::__cxx11::string::compare((char *)&local_98), iVar7 == 0)) {
                    iVar7 = atoi(local_b8._M_dataplus._M_p);
                    local_134 = (int)(1000000000 / (long)(iVar7 / 1000));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p,
                                    local_b8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_98._M_dataplus._M_p != &local_98.field_2) {
                    operator_delete(local_98._M_dataplus._M_p,
                                    local_98.field_2._M_allocated_capacity + 1);
                  }
                }
                pbVar13 = pbVar13 + 1;
              } while (pbVar13 != local_70);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            puVar4 = local_78;
            uVar8 = local_dc;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
              puVar4 = local_78;
              uVar8 = local_dc;
            }
            break;
          default:
            goto switchD_00163165_caseD_5;
          case 0xd:
            if (uVar8 != 0xd0d) {
              __assert_fail("size == 0x0d0d",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                            ,0x147,
                            "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                           );
            }
            uVar8 = 0;
            puVar4 = local_120;
          }
        }
        else {
switchD_00163165_caseD_5:
          util::fmt_abi_cxx11_(&local_158,"unexpected OOB sub-type (%X)");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_130,&local_158);
LAB_00163280:
          puVar4 = local_120;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
            puVar4 = local_120;
          }
        }
        puVar14 = (uint *)((ulong)(uVar8 & 0xffff) + (long)puVar4);
        goto LAB_001631aa;
      default:
        local_158._M_dataplus._M_p._0_4_ = ((iVar12 + (uint)bVar1) * local_134) / 1000;
        if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&local_118,
                     (iterator)
                     local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_158);
        }
        else {
          *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = (uint)local_158._M_dataplus._M_p;
          local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = iVar7 + 1;
        goto LAB_0016311b;
      }
      puVar14 = puVar4;
      uVar9 = (ulong)(iVar7 + 1);
LAB_001631aa:
    } while (puVar14 != local_120);
  }
  this = local_c0;
  puVar3 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar8 = 0;
    puVar10 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar11 = *puVar10;
      if (uVar8 != 0) {
        if (uVar11 != 0) {
          do {
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11] != 0) goto LAB_001635ec;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
          uVar11 = 0;
        }
LAB_001635ec:
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_158,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar8),
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11]),(allocator_type *)&local_98);
        std::
        vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
        ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                  (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_158._M_dataplus._M_p,
                          local_158.field_2._M_allocated_capacity - (long)local_158._M_dataplus._M_p
                         );
        }
      }
      uVar8 = local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar3);
  }
  if (*(long *)(this + 8) == *(long *)this) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"no flux data","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_130,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (FluxData *)this;
switchD_001630ce_caseD_0:
  local_158._M_dataplus._M_p._0_4_ =
       ((iVar12 + (uint)(byte)*puVar4 + (uint)bVar1 * 0x100) * local_134) / 1000;
  if (local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_118,
               (iterator)
               local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_158);
  }
  else {
    *local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = (uint)local_158._M_dataplus._M_p;
    local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  puVar4 = (uint *)((long)puVar4 + 1);
  uVar8 = iVar7 + 2;
LAB_0016311b:
  uVar9 = (ulong)uVar8;
  iVar12 = 0;
  puVar14 = puVar4;
  goto LAB_001631aa;
}

Assistant:

FluxData KryoFlux::DecodeStream(const Data& data, std::vector<std::string>& warnings)
{
    FluxData flux_revs;
    std::vector<uint32_t> flux_times, flux_counts;
    flux_times.reserve(data.size());
    flux_counts.resize(data.size());

    uint32_t time = 0, stream_pos = 0;
    uint32_t ps_per_tick = PS_PER_TICK(SAMPLE_FREQ);
    std::vector<uint32_t> index_offsets;
    int hard_indexes = 0;

    auto itBegin = data.begin(), it = itBegin, itEnd = data.end();
    while (it != itEnd)
    {
        // Store current flux count at each stream position
        flux_counts[stream_pos] = static_cast<int>(flux_times.size());

        auto type = *it++;
        switch (type)
        {
        case 0x0c: // Flux3
            type = *it++;
            stream_pos++;
        case 0x00: case 0x01: case 0x02: case 0x03: // Flux 2
        case 0x04: case 0x05: case 0x06: case 0x07:
            time += (static_cast<uint32_t>(type) << 8) | *it++;
            flux_times.push_back(time * ps_per_tick / 1000);
            stream_pos += 2;
            time = 0;
            break;
        case 0xa:   // Nop3
            it++;
            stream_pos++;
        case 0x9:   // Nop2
            it++;
            stream_pos++;
        case 0x8:   // Nop1
            stream_pos++;
            break;
        case 0xb:   // Ovl16
            time += 0x10000;
            stream_pos++;
            break;

        case OOB:   // OOB
        {
            auto subtype = *it++;
            uint16_t size = *it++;
            size |= (*it++ << 8);

            switch (subtype)
            {
            case 0x00:  // Invalid
                warnings.push_back("invalid OOB detected");
                it = itEnd;
                break;

            case 0x01:  // StreamInfo
                assert(size == 8);
                break;

            case 0x02:  // Index
            {
                assert(size == 12);

                // Soft-sectored disks have a single start-of-track index.
                // Hard-sectors are combined to achieve the same result.
                if (opt.hardsectors <= 1 || !(++hard_indexes % opt.hardsectors))
                {
                    auto pdw = reinterpret_cast<const uint32_t*>(&*it);
                    index_offsets.push_back(util::letoh(pdw[0]));
                }
                break;
            }

            case 0x03:  // StreamEnd
            {
                assert(size == 8);

                auto pdw = reinterpret_cast<const uint32_t*>(&*it);
                //                      auto eof_pos = util::letoh(pdw[0]);
                auto eof_ret = util::letoh(pdw[1]);

                if (eof_ret == 1)
                    warnings.push_back("stream end (buffering problem)");
                else if (eof_ret == 2)
                    warnings.push_back("stream end (no index detected)");
                else if (eof_ret != 0)
                    warnings.push_back(util::fmt("stream end problem (%u)", eof_ret));
                break;
            }

            case 0x04:  // KFInfo
            {
                std::string info = reinterpret_cast<const char*>(&*it);
                for (auto& entry : util::split(info, ','))
                {
                    auto pos = entry.find('=');
                    if (pos != entry.npos)
                    {
                        auto name = util::trim(entry.substr(0, pos));
                        auto value = util::trim(entry.substr(pos + 1));

                        if (!name.empty() && !value.empty())
                        {
                            //                                  disk.metadata[name] = value;

                            if (name == "sck")
                                ps_per_tick = PS_PER_TICK(std::atoi(value.c_str()));
                        }
                    }
                }
                break;
            }

            case 0x0d:  // EOF
                assert(size == 0x0d0d);     // documented value
                size = 0;                   // size is fake, so clear it
                it = itEnd;                 // advance to end
                break;

            default:
                warnings.push_back(util::fmt("unexpected OOB sub-type (%X)", subtype));
                it = itEnd;
                break;
            }

            it += size;
            break;
        }

        default:    // Flux1
            time += type;
            flux_times.push_back(time * ps_per_tick / 1000);
            stream_pos++;
            time = 0;
            break;
        }
    }

    uint32_t last_pos = 0;
    for (auto index_offset : index_offsets)
    {
        // Ignore first partial track
        if (last_pos != 0)
        {
            // Find the most recent flux count.
            while (index_offset && !flux_counts[index_offset])
                --index_offset;

            // Extract flux segment for current revolution
            flux_revs.emplace_back(std::vector<uint32_t>(
                flux_times.begin() + last_pos,
                flux_times.begin() + flux_counts[index_offset]));
        }

        last_pos = flux_counts[index_offset];
    }

    if (flux_revs.size() == 0)
        warnings.push_back("no flux data");

    return flux_revs;
}